

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

base_learner * kernel_svm_setup(options_i *options,vw *all)

{
  size_type *psVar1;
  bool bVar2;
  vw *pvVar3;
  int iVar4;
  svm_params *__s;
  option_group_definition *poVar5;
  typed_option<unsigned_long> *ptVar6;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  typed_option<float> *op_00;
  typed_option<int> *op_01;
  loss_function *plVar7;
  svm_model *psVar8;
  svm_example **ppsVar9;
  ulong uVar10;
  ostream *poVar11;
  double *pdVar12;
  long *plVar13;
  int *piVar14;
  learner<svm_params,_example> *plVar15;
  vw_ostream *pvVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  double dVar19;
  bool ksvm;
  int degree;
  float bandwidth;
  string kernel_type;
  option_group_definition new_options;
  string loss_function;
  bool local_909;
  int local_908;
  float local_904;
  vw *local_900;
  free_ptr<svm_params> local_8f8;
  size_t *local_8e8;
  options_i *local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  size_t *local_8b8;
  bool *local_8b0;
  string local_8a8;
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  string local_848;
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  string local_808;
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  string local_7c8;
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  string local_788;
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  string local_748;
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  string local_708;
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  string local_6c8;
  undefined1 *local_6a8;
  long local_6a0;
  undefined1 local_698 [16];
  option_group_definition local_688;
  string local_650;
  undefined1 *local_630 [2];
  undefined1 local_620 [16];
  string local_610;
  undefined1 *local_5f0 [2];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [112];
  bool local_560;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  typed_option<unsigned_long> local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  undefined1 local_3f0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<int> local_2b0;
  typed_option<float> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_long> local_d0;
  
  local_8e0 = options;
  __s = calloc_or_throw<svm_params>(1);
  memset(__s,0,0x90);
  local_8f8._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<svm_params>;
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  local_8d8._M_string_length = 0;
  local_8d8.field_2._M_local_buf[0] = '\0';
  local_904 = 1.0;
  local_908 = 2;
  local_909 = false;
  local_8f8._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.super__Head_base<0UL,_svm_params_*,_false>.
  _M_head_impl = __s;
  local_6a8 = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a8,"Kernel SVM","");
  local_688.m_name._M_dataplus._M_p = (pointer)&local_688.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_688,local_6a8,local_6a8 + local_6a0);
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_688.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6a8 != local_698) {
    operator_delete(local_6a8);
  }
  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"ksvm","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_6c8,&local_909);
  local_560 = true;
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"kernel svm","");
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_688,(typed_option<bool> *)local_5d0);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"reprocess","");
  VW::config::typed_option<unsigned_long>::typed_option(&local_530,&local_708,&__s->reprocess);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_530,1);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_728,"number of reprocess steps for LASVM","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,ptVar6);
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"pool_greedy","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_748,&__s->active_pool_greedy);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,"use greedy selection on mini pools","");
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_350);
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"para_active","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_788,&__s->para_active);
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,"do parallel active learning","");
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_3f0);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"pool_size","");
  local_8e8 = &__s->pool_size;
  VW::config::typed_option<unsigned_long>::typed_option(&local_d0,&local_7c8,local_8e8);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_d0,1);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,"size of pools for active learning","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,ptVar6);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"subsample","");
  local_8b8 = &__s->subsample;
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,&local_808,local_8b8);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value(&local_170,1);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,"number of items to subsample from the pool","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,ptVar6);
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"kernel","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,&local_848,&local_8d8);
  local_490.super_base_option.m_keep = true;
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"linear","");
  op = VW::config::
       typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::default_value(&local_490,&local_868);
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,"type of kernel (rbf or linear (default))","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar5,op);
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"bandwidth","");
  VW::config::typed_option<float>::typed_option(&local_210,&local_8a8,&local_904);
  local_210.super_base_option.m_keep = true;
  local_900 = all;
  op_00 = VW::config::typed_option<float>::default_value(&local_210,1.0);
  local_5f0[0] = local_5e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5f0,"bandwidth of rbf kernel","");
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar5,op_00);
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"degree","");
  VW::config::typed_option<int>::typed_option(&local_2b0,&local_610,&local_908);
  local_2b0.super_base_option.m_keep = true;
  local_8b0 = &__s->para_active;
  op_01 = VW::config::typed_option<int>::default_value(&local_2b0,2);
  local_630[0] = local_620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"degree of poly kernel","");
  std::__cxx11::string::_M_assign((string *)&(op_01->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,op_01);
  if (local_630[0] != local_620) {
    operator_delete(local_630[0]);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d96b0;
  if (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p);
  }
  if (local_5f0[0] != local_5e0) {
    operator_delete(local_5f0[0]);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9148;
  if (local_490.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9070;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9070;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0]);
  }
  local_3f0._0_8_ = &PTR__typed_option_002d9110;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0]);
  }
  local_350._0_8_ = &PTR__typed_option_002d9110;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  if (local_728[0] != local_718) {
    operator_delete(local_728[0]);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9070;
  if (local_530.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p);
  }
  if (local_6e8[0] != local_6d8) {
    operator_delete(local_6e8[0]);
  }
  local_5d0._0_8_ = &PTR__typed_option_002d9110;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
    operator_delete(local_6c8._M_dataplus._M_p);
  }
  (**local_8e0->_vptr_options_i)(local_8e0,&local_688);
  if (local_909 == false) {
    plVar15 = (learner<svm_params,_example> *)0x0;
    goto LAB_0020ad4f;
  }
  local_5d0._0_8_ = local_5d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d0,"hinge","");
  if (local_900->loss != (loss_function *)0x0) {
    (*local_900->loss->_vptr_loss_function[9])();
  }
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_650,local_5d0._0_8_,(pointer)(local_5d0._8_8_ + local_5d0._0_8_));
  pvVar3 = local_900;
  plVar7 = getLossFunction(local_900,&local_650,0.0);
  pvVar3->loss = plVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  psVar8 = calloc_or_throw<svm_model>(1);
  __s->model = psVar8;
  psVar8->num_support = 0;
  __s->maxcache = 0x40000000;
  __s->loss_sum = 0.0;
  __s->all = local_900;
  if (local_900->active == true) {
    __s->active = true;
LAB_0020a9b1:
    __s->active_c = 1.0;
  }
  else if ((__s->active & 1U) != 0) goto LAB_0020a9b1;
  ppsVar9 = calloc_or_throw<svm_example*>(*local_8e8);
  __s->pool = ppsVar9;
  __s->pool_pos = 0;
  psVar1 = &local_530.super_base_option.m_name._M_string_length;
  local_530.super_base_option._vptr_base_option = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"subsample","");
  iVar4 = (*local_8e0->_vptr_options_i[1])(local_8e0,&local_530);
  if ((char)iVar4 == '\0') {
    bVar2 = *local_8b0;
    if (local_530.super_base_option._vptr_base_option != (_func_int **)psVar1) {
      operator_delete(local_530.super_base_option._vptr_base_option);
    }
    if (bVar2 != false) {
      uVar10 = *local_8e8 / local_900->all_reduce->total;
      auVar18._8_4_ = (int)(uVar10 >> 0x20);
      auVar18._0_8_ = uVar10;
      auVar18._12_4_ = 0x45300000;
      dVar19 = (auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
      uVar10 = (ulong)dVar19;
      *local_8b8 = (long)(dVar19 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    }
  }
  else if (local_530.super_base_option._vptr_base_option != (_func_int **)psVar1) {
    operator_delete(local_530.super_base_option._vptr_base_option);
  }
  uVar17 = -(uint)(local_900->l2_lambda == 0.0);
  __s->lambda = (float)(~uVar17 & (uint)local_900->l2_lambda | uVar17 & 0x3f800000);
  std::__ostream_insert<char,std::char_traits<char>>
            (&(__s->all->trace_message).super_ostream,"Lambda = ",9);
  poVar11 = std::ostream::_M_insert<double>((double)__s->lambda);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  pvVar16 = &__s->all->trace_message;
  std::__ostream_insert<char,std::char_traits<char>>(&pvVar16->super_ostream,"Kernel = ",9);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (&pvVar16->super_ostream,local_8d8._M_dataplus._M_p,local_8d8._M_string_length
                      );
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  iVar4 = std::__cxx11::string::compare((char *)&local_8d8);
  if (iVar4 == 0) {
    __s->kernel_type = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              (&(__s->all->trace_message).super_ostream,"bandwidth = ",0xc);
    poVar11 = std::ostream::_M_insert<double>((double)local_904);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pdVar12 = calloc_or_throw<double>(1);
    __s->kernel_params = pdVar12;
    *(float *)pdVar12 = local_904;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_8d8);
    if (iVar4 == 0) {
      __s->kernel_type = 2;
      pvVar16 = &__s->all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>(&pvVar16->super_ostream,"degree = ",9);
      plVar13 = (long *)std::ostream::operator<<(pvVar16,local_908);
      std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
      std::ostream::put((char)plVar13);
      std::ostream::flush();
      piVar14 = calloc_or_throw<int>(1);
      __s->kernel_params = piVar14;
      *piVar14 = local_908;
    }
    else {
      __s->kernel_type = 0;
    }
  }
  pvVar3 = __s->all;
  if ((pvVar3->weights).sparse == true) {
    sparse_parameters::stride_shift(&(pvVar3->weights).sparse_weights,0);
  }
  else {
    (pvVar3->weights).dense_weights._stride_shift = 0;
  }
  plVar15 = LEARNER::init_learner<svm_params,example,LEARNER::learner<char,example>>
                      (&local_8f8,learn,predict,1);
  *(code **)(plVar15 + 0x80) = save_load;
  *(undefined8 *)(plVar15 + 0x70) = *(undefined8 *)(plVar15 + 0x18);
  *(undefined8 *)(plVar15 + 0x78) = *(undefined8 *)(plVar15 + 0x20);
  *(undefined8 *)(plVar15 + 0xb8) = *(undefined8 *)(plVar15 + 0x18);
  *(undefined8 *)(plVar15 + 0xc0) = *(undefined8 *)(plVar15 + 0x20);
  *(code **)(plVar15 + 200) = finish;
  if ((undefined1 *)local_5d0._0_8_ != local_5d0 + 0x10) {
    operator_delete((void *)local_5d0._0_8_);
  }
LAB_0020ad4f:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_688.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_688.m_name._M_dataplus._M_p != &local_688.m_name.field_2) {
    operator_delete(local_688.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p);
  }
  if (local_8f8._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_svm_params_*,_false>._M_head_impl != (svm_params *)0x0) {
    (*(code *)local_8f8._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_8f8._M_t.super___uniq_ptr_impl<svm_params,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_svm_params_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_svm_params_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar15;
}

Assistant:

LEARNER::base_learner* kernel_svm_setup(options_i& options, vw& all)
{
  auto params = scoped_calloc_or_throw<svm_params>();
  std::string kernel_type;
  float bandwidth = 1.f;
  int degree = 2;

  bool ksvm = false;

  option_group_definition new_options("Kernel SVM");
  new_options.add(make_option("ksvm", ksvm).keep().help("kernel svm"))
      .add(make_option("reprocess", params->reprocess).default_value(1).help("number of reprocess steps for LASVM"))
      .add(make_option("pool_greedy", params->active_pool_greedy).help("use greedy selection on mini pools"))
      .add(make_option("para_active", params->para_active).help("do parallel active learning"))
      .add(make_option("pool_size", params->pool_size).default_value(1).help("size of pools for active learning"))
      .add(make_option("subsample", params->subsample)
               .default_value(1)
               .help("number of items to subsample from the pool"))
      .add(make_option("kernel", kernel_type)
               .keep()
               .default_value("linear")
               .help("type of kernel (rbf or linear (default))"))
      .add(make_option("bandwidth", bandwidth).keep().default_value(1.f).help("bandwidth of rbf kernel"))
      .add(make_option("degree", degree).keep().default_value(2).help("degree of poly kernel"));
  options.add_and_parse(new_options);

  if (!ksvm)
  {
    return nullptr;
  }

  string loss_function = "hinge";
  float loss_parameter = 0.0;
  delete all.loss;
  all.loss = getLossFunction(all, loss_function, (float)loss_parameter);

  params->model = &calloc_or_throw<svm_model>();
  params->model->num_support = 0;
  params->maxcache = 1024 * 1024 * 1024;
  params->loss_sum = 0.;
  params->all = &all;

  // This param comes from the active reduction.
  // During options refactor: this changes the semantics a bit - now this will only be true if --active was supplied and
  // NOT --simulation
  if (all.active)
    params->active = true;
  if (params->active)
    params->active_c = 1.;

  params->pool = calloc_or_throw<svm_example*>(params->pool_size);
  params->pool_pos = 0;

  if (!options.was_supplied("subsample") && params->para_active)
    params->subsample = (size_t)ceil(params->pool_size / all.all_reduce->total);

  params->lambda = all.l2_lambda;
  if (params->lambda == 0.)
    params->lambda = 1.;
  params->all->trace_message << "Lambda = " << params->lambda << endl;
  params->all->trace_message << "Kernel = " << kernel_type << endl;

  if (kernel_type.compare("rbf") == 0)
  {
    params->kernel_type = SVM_KER_RBF;
    params->all->trace_message << "bandwidth = " << bandwidth << endl;
    params->kernel_params = &calloc_or_throw<double>();
    *((float*)params->kernel_params) = bandwidth;
  }
  else if (kernel_type.compare("poly") == 0)
  {
    params->kernel_type = SVM_KER_POLY;
    params->all->trace_message << "degree = " << degree << endl;
    params->kernel_params = &calloc_or_throw<int>();
    *((int*)params->kernel_params) = degree;
  }
  else
    params->kernel_type = SVM_KER_LIN;

  params->all->weights.stride_shift(0);

  learner<svm_params, example>& l = init_learner(params, learn, predict, 1);
  l.set_save_load(save_load);
  l.set_finish(finish);
  return make_base(l);
}